

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O1

void __thiscall
TasGrid::GridWavelet::GridWavelet
          (GridWavelet *this,AccelerationContext *acc,MultiIndexSet *pset,int cnum_outputs,
          int corder,Data2D<double> *vals)

{
  pointer *__ptr;
  pointer *__ptr_1;
  pointer *__ptr_2;
  MultiIndexSet local_80;
  StorageSet local_58;
  
  local_80.num_dimensions = 0;
  local_80._8_8_ = local_80._8_8_ & 0xffffffff00000000;
  local_80.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_80.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_80.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.num_outputs = 0;
  local_58.num_values = 0;
  BaseCanonicalGrid::BaseCanonicalGrid
            (&this->super_BaseCanonicalGrid,acc,(int)pset->num_dimensions,cnum_outputs,pset,
             &local_80,&local_58);
  if (local_58.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.values.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.values.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_80.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  (this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid = (_func_int **)&PTR__GridWavelet_001f6470
  ;
  RuleWavelet::RuleWavelet(&this->rule1D,corder,10);
  this->order = corder;
  (this->coefficients).stride = 0;
  (this->coefficients).num_strips = 0;
  (this->coefficients).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->coefficients).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->coefficients).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->inter_matrix).tol = 1e-12;
  (this->inter_matrix).num_rows = 0;
  memset(&(this->inter_matrix).pntr,0,0xe0);
  local_80.num_dimensions = (size_t)(this->super_BaseCanonicalGrid).num_outputs;
  if (0 < (long)local_80.num_dimensions) {
    local_80._8_8_ = SEXT48((this->super_BaseCanonicalGrid).points.cache_num_indexes);
    local_80.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(vals->vec).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
    local_80.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)(vals->vec).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    local_80.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)(vals->vec).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    (vals->vec).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (vals->vec).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (vals->vec).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (this->super_BaseCanonicalGrid).values.num_outputs = local_80.num_dimensions;
    (this->super_BaseCanonicalGrid).values.num_values = local_80._8_8_;
    ::std::vector<double,_std::allocator<double>_>::operator=
              (&(this->super_BaseCanonicalGrid).values.values,
               (vector<double,_std::allocator<double>_> *)&local_80.indexes);
    if ((pointer)local_80.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    recomputeCoefficients(this);
  }
  return;
}

Assistant:

GridWavelet::GridWavelet(AccelerationContext const *acc, MultiIndexSet &&pset, int cnum_outputs, int corder, Data2D<double> &&vals) :
    BaseCanonicalGrid(acc, static_cast<int>(pset.getNumDimensions()), cnum_outputs, std::forward<MultiIndexSet>(pset),
                      MultiIndexSet(), StorageSet()),
    rule1D(corder, 10),
    order(corder)
{
    if (num_outputs > 0){
        values = StorageSet(num_outputs, points.getNumIndexes(), vals.release());
        recomputeCoefficients();
    }
}